

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O3

bool __thiscall
Assimp::EmbedTexturesProcess::addTexture(EmbedTexturesProcess *this,aiScene *pScene,string *path)

{
  uint uVar1;
  pointer pcVar2;
  aiTexture **__src;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  Logger *pLVar7;
  long *plVar8;
  aiTexel *paVar9;
  aiTexture **__dest;
  aiTexture *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  ulong uVar13;
  char *pcVar14;
  string imagePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension;
  ifstream file;
  char *local_3f0 [2];
  char local_3e0 [16];
  char *local_3d0;
  long local_3c8;
  char local_3c0 [16];
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  string local_238 [520];
  
  local_3d0 = local_3c0;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,pcVar2,pcVar2 + path->_M_string_length);
  std::ifstream::ifstream(local_238,(string *)&local_3d0,_S_bin|_S_ate);
  uVar6 = std::istream::tellg();
  if (uVar6 == 0xffffffffffffffff) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[42]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
               (char (*) [42])"EmbedTexturesProcess: Cannot find image: ");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,local_3d0,local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,". Will try to find it in root folder.",0x25);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,local_3f0[0]);
    if (local_3f0[0] != local_3e0) {
      operator_delete(local_3f0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                   &this->mRootPath,path);
    std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != local_3a0) {
      operator_delete((void *)local_3b0._0_8_);
    }
    std::ifstream::open(local_238,(_Ios_Openmode)&local_3d0);
    uVar6 = std::istream::tellg();
    if (uVar6 == 0xffffffffffffffff) {
      std::__cxx11::string::find_last_of((char *)path,0x1f0b20,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_3f0,(ulong)path);
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_3f0,0,(char *)0x0,
                                  (ulong)(this->mRootPath)._M_dataplus._M_p);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar11) {
        local_3a0[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_3a0[0]._8_8_ = plVar8[3];
        local_3b0._0_8_ = local_3a0;
      }
      else {
        local_3a0[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_3b0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_3b0._8_8_ = plVar8[1];
      *plVar8 = (long)paVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_);
      }
      if (local_3f0[0] != local_3e0) {
        operator_delete(local_3f0[0]);
      }
      std::ifstream::open(local_238,(_Ios_Openmode)&local_3d0);
      uVar6 = std::istream::tellg();
      if (uVar6 == 0xffffffffffffffff) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[48]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0
                   ,(char (*) [48])"EmbedTexturesProcess: Unable to embed texture: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,".",1);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar7,local_3f0[0]);
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0]);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        bVar12 = false;
        goto LAB_0014f212;
      }
    }
  }
  uVar13 = 0xffffffffffffffff;
  if (uVar6 < 0xfffffffffffffffc) {
    uVar13 = (uVar6 & 0xfffffffffffffffc) + 4;
  }
  paVar9 = (aiTexel *)operator_new__(uVar13);
  std::istream::seekg((long)local_238,_S_beg);
  std::istream::read((char *)local_238,(long)paVar9);
  uVar1 = pScene->mNumTextures;
  pScene->mNumTextures = uVar1 + 1;
  __src = pScene->mTextures;
  __dest = (aiTexture **)operator_new__((ulong)(uVar1 + 1) << 3);
  pScene->mTextures = __dest;
  memmove(__dest,__src,(ulong)uVar1 * 8);
  paVar10 = (aiTexture *)operator_new(0x428);
  (paVar10->mFilename).length = 0;
  (paVar10->mFilename).data[0] = '\0';
  memset((paVar10->mFilename).data + 1,0x1b,0x3ff);
  paVar10->mHeight = 0;
  paVar10->achFormatHint[0] = '\0';
  paVar10->achFormatHint[1] = '\0';
  paVar10->achFormatHint[2] = '\0';
  paVar10->achFormatHint[3] = '\0';
  paVar10->mWidth = (uint)uVar6;
  paVar10->pcData = paVar9;
  std::__cxx11::string::rfind((char)path,0x2e);
  std::__cxx11::string::substr((ulong)local_3b0,(ulong)path);
  uVar4 = local_3b0._8_8_;
  uVar3 = local_3b0._0_8_;
  if ((char *)local_3b0._8_8_ != (char *)0x0) {
    pcVar14 = (char *)0x0;
    do {
      iVar5 = tolower((int)*(char *)(uVar3 + (long)pcVar14));
      *(char *)(uVar3 + (long)pcVar14) = (char)iVar5;
      pcVar14 = pcVar14 + 1;
    } while ((char *)uVar4 != pcVar14);
  }
  iVar5 = std::__cxx11::string::compare(local_3b0);
  if (iVar5 == 0) {
    std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)local_3b0._8_8_,0x1ecaa6);
  }
  pcVar14 = (char *)0x8;
  if ((ulong)local_3b0._8_8_ < (char *)0x8) {
    pcVar14 = (char *)local_3b0._8_8_;
  }
  strncpy(paVar10->achFormatHint,(char *)local_3b0._0_8_,(size_t)pcVar14);
  pScene->mTextures[uVar1] = paVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_);
  }
  bVar12 = true;
LAB_0014f212:
  std::ifstream::~ifstream(local_238);
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  return bVar12;
}

Assistant:

bool EmbedTexturesProcess::addTexture(aiScene* pScene, std::string path) const {
    std::streampos imageSize = 0;
    std::string    imagePath = path;

    // Test path directly
    std::ifstream file(imagePath, std::ios::binary | std::ios::ate);
    if ((imageSize = file.tellg()) == std::streampos(-1)) {
        ASSIMP_LOG_WARN_F("EmbedTexturesProcess: Cannot find image: ", imagePath, ". Will try to find it in root folder.");

        // Test path in root path
        imagePath = mRootPath + path;
        file.open(imagePath, std::ios::binary | std::ios::ate);
        if ((imageSize = file.tellg()) == std::streampos(-1)) {
            // Test path basename in root path
            imagePath = mRootPath + path.substr(path.find_last_of("\\/") + 1u);
            file.open(imagePath, std::ios::binary | std::ios::ate);
            if ((imageSize = file.tellg()) == std::streampos(-1)) {
                ASSIMP_LOG_ERROR_F("EmbedTexturesProcess: Unable to embed texture: ", path, ".");
                return false;
            }
        }
    }

    aiTexel* imageContent = new aiTexel[ 1ul + static_cast<unsigned long>( imageSize ) / sizeof(aiTexel)];
    file.seekg(0, std::ios::beg);
    file.read(reinterpret_cast<char*>(imageContent), imageSize);

    // Enlarging the textures table
    unsigned int textureId = pScene->mNumTextures++;
    auto oldTextures = pScene->mTextures;
    pScene->mTextures = new aiTexture*[pScene->mNumTextures];
    ::memmove(pScene->mTextures, oldTextures, sizeof(aiTexture*) * (pScene->mNumTextures - 1u));

    // Add the new texture
    auto pTexture = new aiTexture;
    pTexture->mHeight = 0; // Means that this is still compressed
    pTexture->mWidth = static_cast<uint32_t>(imageSize);
    pTexture->pcData = imageContent;

    auto extension = path.substr(path.find_last_of('.') + 1u);
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    if (extension == "jpeg") {
        extension = "jpg";
    }

    size_t len = extension.size();
    if (len > HINTMAXTEXTURELEN -1 ) {
        len = HINTMAXTEXTURELEN - 1;
    }
    ::strncpy(pTexture->achFormatHint, extension.c_str(), len);
    pScene->mTextures[textureId] = pTexture;

    return true;
}